

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerializationDeviceImpl.cpp
# Opt level: O0

void __thiscall
Diligent::SerializationDeviceImpl::GetPipelineResourceBindings
          (SerializationDeviceImpl *this,PipelineResourceBindingAttribs *Info,Uint32 *NumBindings,
          PipelineResourceBinding **pBindings)

{
  size_type sVar1;
  PipelineResourceBinding *pPVar2;
  PipelineResourceBinding **pBindings_local;
  Uint32 *NumBindings_local;
  PipelineResourceBindingAttribs *Info_local;
  SerializationDeviceImpl *this_local;
  
  *NumBindings = 0;
  *pBindings = (PipelineResourceBinding *)0x0;
  std::vector<Diligent::PipelineResourceBinding,_std::allocator<Diligent::PipelineResourceBinding>_>
  ::clear(&this->m_ResourceBindings);
  switch(Info->DeviceType) {
  case RENDER_DEVICE_TYPE_UNDEFINED:
  case RENDER_DEVICE_TYPE_COUNT:
  default:
    return;
  case RENDER_DEVICE_TYPE_GL:
  case RENDER_DEVICE_TYPE_GLES:
    GetPipelineResourceBindingsGL(Info,&this->m_ResourceBindings);
    break;
  case RENDER_DEVICE_TYPE_VULKAN:
    GetPipelineResourceBindingsVk(Info,&this->m_ResourceBindings);
  }
  sVar1 = std::
          vector<Diligent::PipelineResourceBinding,_std::allocator<Diligent::PipelineResourceBinding>_>
          ::size(&this->m_ResourceBindings);
  *NumBindings = (Uint32)sVar1;
  pPVar2 = std::
           vector<Diligent::PipelineResourceBinding,_std::allocator<Diligent::PipelineResourceBinding>_>
           ::data(&this->m_ResourceBindings);
  *pBindings = pPVar2;
  return;
}

Assistant:

void SerializationDeviceImpl::GetPipelineResourceBindings(const PipelineResourceBindingAttribs& Info,
                                                          Uint32&                               NumBindings,
                                                          const PipelineResourceBinding*&       pBindings)
{
    NumBindings = 0;
    pBindings   = nullptr;
    m_ResourceBindings.clear();

    switch (Info.DeviceType)
    {
#if D3D11_SUPPORTED
        case RENDER_DEVICE_TYPE_D3D11:
            GetPipelineResourceBindingsD3D11(Info, m_ResourceBindings);
            break;
#endif
#if D3D12_SUPPORTED
        case RENDER_DEVICE_TYPE_D3D12:
            GetPipelineResourceBindingsD3D12(Info, m_ResourceBindings);
            break;
#endif
#if GL_SUPPORTED || GLES_SUPPORTED
        case RENDER_DEVICE_TYPE_GL:
        case RENDER_DEVICE_TYPE_GLES:
            GetPipelineResourceBindingsGL(Info, m_ResourceBindings);
            break;
#endif
#if VULKAN_SUPPORTED
        case RENDER_DEVICE_TYPE_VULKAN:
            GetPipelineResourceBindingsVk(Info, m_ResourceBindings);
            break;
#endif
#if METAL_SUPPORTED
        case RENDER_DEVICE_TYPE_METAL:
            GetPipelineResourceBindingsMtl(Info, m_ResourceBindings, m_MtlProps.MaxBufferFunctionArgumets);
            break;
#endif
        case RENDER_DEVICE_TYPE_UNDEFINED:
        case RENDER_DEVICE_TYPE_COUNT:
        default:
            return;
    }

    NumBindings = static_cast<Uint32>(m_ResourceBindings.size());
    pBindings   = m_ResourceBindings.data();
}